

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::UnpackInlinedValueRep
          (CrateReader *this,ValueRep *rep,CrateValue *value)

{
  float *this_00;
  half *this_01;
  undefined2 uVar1;
  bool bVar2;
  half hVar3;
  uint uVar4;
  float v_18;
  int iVar5;
  ostream *poVar6;
  error_type *peVar7;
  value_type *pvVar8;
  uint64_t uVar9;
  value_type *pvVar10;
  string *psVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  reference pvVar16;
  reference pvVar17;
  reference pvVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  reference pvVar22;
  int32_t type_id;
  CrateDataTypeId did;
  CrateDataTypeId did_00;
  CrateDataTypeId did_01;
  string local_1860;
  string local_1840;
  string local_1820 [32];
  ostringstream local_1800 [8];
  ostringstream ss_e_11;
  string local_1688;
  string local_1668;
  allocator local_1641;
  string local_1640 [32];
  fmt local_1620 [32];
  ostringstream local_1600 [8];
  ostringstream ss_e_10;
  string local_1488;
  string local_1468;
  allocator local_1441;
  string local_1440 [32];
  fmt local_1420 [32];
  ostringstream local_1400 [8];
  ostringstream ss_e_9;
  ValueBlock local_1281;
  undefined1 local_1280 [7];
  ValueBlock block;
  CustomDataType dict;
  int4 v_17;
  int8_t data_14 [4];
  array<tinyusdz::value::half,_4UL> local_1230;
  half4 v_16;
  int8_t data_13 [4];
  float4 v_15;
  int8_t data_12 [4];
  double4 v_14;
  undefined1 local_11e8 [4];
  int8_t data_11 [4];
  int3 v_13;
  half hStack_11d4;
  int8_t data_10 [3];
  half3 v_12;
  int8_t data_9 [3];
  float3 v_11;
  int8_t data_8 [3];
  double3 v_10;
  int8_t data_7 [3];
  int2 v_9;
  int8_t data_6 [2];
  half3 v_8;
  int8_t data_5 [2];
  float2 v_7;
  int8_t data_4 [2];
  double2 v_6;
  undefined1 local_1160 [6];
  int8_t data_3 [2];
  ostringstream local_1140 [8];
  ostringstream ss_e_8;
  undefined1 auStack_fc8 [8];
  matrix4d v_5;
  char cStack_f3b;
  char cStack_f39;
  undefined1 auStack_f38 [4];
  int8_t data_2 [4];
  matrix3d v_4;
  undefined1 auStack_ee8 [4];
  int8_t data_1 [3];
  matrix2d v_3;
  double dStack_eb8;
  int8_t data [2];
  double f_2;
  float local_ea8;
  float _f;
  float f_1;
  half f;
  uint64_t ival_2;
  long lStack_e90;
  uint32_t _ival_1;
  int64_t ival_1;
  int _ival;
  uint32_t val_4;
  int ival;
  float local_e74;
  float fStack_e70;
  uint8_t val_3;
  Variability val_2;
  Permission val_1;
  Specifier val;
  ostringstream local_e48 [8];
  ostringstream ss_e_7;
  undefined1 local_cd0 [8];
  string str_1;
  undefined1 local_ca8 [8];
  optional<tinyusdz::Token> v_2;
  ostringstream local_c60 [8];
  ostringstream ss_e_6;
  undefined1 local_ae8 [8];
  token tok;
  undefined1 local_ac0 [8];
  optional<tinyusdz::Token> v_1;
  ostringstream local_a78 [8];
  ostringstream ss_e_5;
  undefined1 local_900 [8];
  AssetPath assetp;
  string str;
  undefined1 local_898 [8];
  optional<tinyusdz::Token> v;
  string local_868;
  ostringstream local_848 [8];
  ostringstream ss_e_4;
  undefined2 local_6cc;
  char cStack_6ca;
  uint32_t d;
  value_type dty;
  ostringstream local_698 [8];
  ostringstream ss_e_3;
  string local_520;
  ostringstream local_500 [8];
  ostringstream ss_e_2;
  string local_380;
  ostringstream local_360 [8];
  ostringstream ss_e_1;
  undefined1 local_1e8 [8];
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  CrateValue *value_local;
  ValueRep *rep_local;
  CrateReader *this_local;
  
  bVar2 = ValueRep::IsInlined(rep);
  if (bVar2) {
    uVar4 = ValueRep::GetType(rep);
    GetCrateDataType_abi_cxx11_
              ((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1e8,(crate *)(ulong)uVar4,type_id);
    bVar2 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_1e8);
    if (bVar2) {
      bVar2 = ValueRep::IsCompressed(rep);
      if (bVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_500);
        poVar6 = ::std::operator<<((ostream *)local_500,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x726);
        ::std::operator<<(poVar6," ");
        poVar6 = ::std::operator<<((ostream *)local_500,"Inlinved value must not be compressed.");
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_520);
        ::std::__cxx11::string::~string((string *)&local_520);
        ::std::__cxx11::ostringstream::~ostringstream(local_500);
        this_local._7_1_ = false;
      }
      else {
        bVar2 = ValueRep::IsArray(rep);
        if (bVar2) {
          ::std::__cxx11::ostringstream::ostringstream(local_698);
          poVar6 = ::std::operator<<((ostream *)local_698,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x72b);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)local_698,"Inlined value must not be an array.");
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&dty.dtype_id);
          ::std::__cxx11::string::~string((string *)&dty.dtype_id);
          ::std::__cxx11::ostringstream::~ostringstream(local_698);
          this_local._7_1_ = false;
        }
        else {
          pvVar8 = nonstd::expected_lite::
                   expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_1e8);
          dty.name = *(char **)&pvVar8->dtype_id;
          uVar9 = ValueRep::GetPayload(rep);
          v_18 = (float)uVar9;
          cStack_6ca = (char)(uVar9 >> 0x10);
          local_6cc = (undefined2)uVar9;
          uVar1 = local_6cc;
          local_6cc._0_1_ = (char)uVar9;
          cStack_f3b = (char)(uVar9 >> 8);
          cStack_f39 = (char)(uVar9 >> 0x18);
          switch((ulong)dty.name & 0xffffffff) {
          case 0:
          case 0x39:
            ::std::__cxx11::ostringstream::ostringstream(local_848);
            poVar6 = ::std::operator<<((ostream *)local_848,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x739);
            ::std::operator<<(poVar6," ");
            poVar6 = ::std::operator<<((ostream *)local_848,"`Invalid` DataType.");
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_868);
            ::std::__cxx11::string::~string((string *)&local_868);
            ::std::__cxx11::ostringstream::~ostringstream(local_848);
            this_local._7_1_ = false;
            break;
          case 1:
            v.contained._31_1_ = -(v_18 != 0.0) & 1;
            CrateValue::Set(value,(bool *)((long)&v.contained + 0x1f));
            this_local._7_1_ = true;
            break;
          case 2:
            ival._3_1_ = (char)local_6cc;
            val_4 = (uint)v_18 & 0xff;
            CrateValue::Set(value,(int *)&val_4);
            this_local._7_1_ = true;
            break;
          case 3:
            _ival = (int)v_18;
            CrateValue::Set(value,&_ival);
            this_local._7_1_ = true;
            break;
          case 4:
            ival_1._4_4_ = v_18;
            CrateValue::Set(value,(uint32_t *)((long)&ival_1 + 4));
            this_local._7_1_ = true;
            break;
          case 5:
            lStack_e90 = (long)(int)v_18;
            ival_1._0_4_ = v_18;
            CrateValue::Set(value,&stack0xfffffffffffff170);
            this_local._7_1_ = true;
            break;
          case 6:
            _f_1 = uVar9 & 0xffffffff;
            CrateValue::Set(value,(uint64_t *)&f_1);
            this_local._7_1_ = true;
            break;
          case 7:
            _f._2_2_ = uVar1;
            CrateValue::Set(value,(half *)((long)&_f + 2));
            this_local._7_1_ = true;
            break;
          case 8:
            local_ea8 = v_18;
            CrateValue::Set(value,&local_ea8);
            this_local._7_1_ = true;
            break;
          case 9:
            dStack_eb8 = (double)v_18;
            CrateValue::Set(value,&stack0xfffffffffffff148);
            this_local._7_1_ = true;
            break;
          case 10:
            Index::Index((Index *)((long)&str_1.field_2 + 0xc),(uint32_t)v_18);
            GetStringToken((optional<tinyusdz::Token> *)local_ca8,this,(Index)str_1.field_2._12_4_);
            this_local._7_1_ =
                 nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_ca8);
            if (this_local._7_1_) {
              pvVar10 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                  ((optional<tinyusdz::Token> *)local_ca8);
              psVar11 = Token::str_abi_cxx11_(pvVar10);
              ::std::__cxx11::string::string((string *)local_cd0,(string *)psVar11);
              CrateValue::Set(value,(string *)local_cd0);
              ::std::__cxx11::string::~string((string *)local_cd0);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_e48);
              poVar6 = ::std::operator<<((ostream *)local_e48,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x765);
              ::std::operator<<(poVar6," ");
              poVar6 = ::std::operator<<((ostream *)local_e48,"Invalid Index for StringToken.");
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)&val_1);
              ::std::__cxx11::string::~string((string *)&val_1);
              ::std::__cxx11::ostringstream::~ostringstream(local_e48);
            }
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)local_ca8);
            break;
          case 0xb:
            Index::Index((Index *)((long)&tok.str_.field_2 + 0xc),(uint32_t)v_18);
            GetToken((optional<tinyusdz::Token> *)local_ac0,this,(Index)tok.str_.field_2._12_4_);
            this_local._7_1_ =
                 nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_ac0);
            if (this_local._7_1_) {
              pvVar10 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                  ((optional<tinyusdz::Token> *)local_ac0);
              Token::Token((Token *)local_ae8,pvVar10);
              CrateValue::Set(value,(token *)local_ae8);
              Token::~Token((Token *)local_ae8);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_c60);
              poVar6 = ::std::operator<<((ostream *)local_c60,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x757);
              ::std::operator<<(poVar6," ");
              poVar6 = ::std::operator<<((ostream *)local_c60,"Invalid Index for Token.");
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)((long)&v_2.contained + 0x18));
              ::std::__cxx11::string::~string((string *)((long)&v_2.contained + 0x18));
              ::std::__cxx11::ostringstream::~ostringstream(local_c60);
            }
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)local_ac0);
            break;
          case 0xc:
            Index::Index((Index *)((long)&str.field_2 + 0xc),(uint32_t)v_18);
            GetToken((optional<tinyusdz::Token> *)local_898,this,(Index)str.field_2._12_4_);
            this_local._7_1_ =
                 nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_898);
            if (this_local._7_1_) {
              pvVar10 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                                  ((optional<tinyusdz::Token> *)local_898);
              psVar11 = Token::str_abi_cxx11_(pvVar10);
              ::std::__cxx11::string::string
                        ((string *)(assetp.resolved_path_.field_2._M_local_buf + 8),
                         (string *)psVar11);
              tinyusdz::value::AssetPath::AssetPath
                        ((AssetPath *)local_900,(string *)((long)&assetp.resolved_path_.field_2 + 8)
                        );
              CrateValue::Set(value,(AssetPath *)local_900);
              tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_900);
              ::std::__cxx11::string::~string
                        ((string *)(assetp.resolved_path_.field_2._M_local_buf + 8));
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_a78);
              poVar6 = ::std::operator<<((ostream *)local_a78,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x749);
              ::std::operator<<(poVar6," ");
              poVar6 = ::std::operator<<((ostream *)local_a78,"Invalid Index for AssetPath.");
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)((long)&v_1.contained + 0x18));
              ::std::__cxx11::string::~string((string *)((long)&v_1.contained + 0x18));
              ::std::__cxx11::ostringstream::~ostringstream(local_a78);
            }
            nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                      ((optional<tinyusdz::Token> *)local_898);
            break;
          case 0xd:
            tinyusdz::value::matrix2d::matrix2d((matrix2d *)auStack_ee8);
            _auStack_ee8 = (double)(int)(char)local_6cc;
            CrateValue::Set(value,(matrix2d *)auStack_ee8);
            this_local._7_1_ = true;
            break;
          case 0xe:
            tinyusdz::value::matrix3d::matrix3d((matrix3d *)auStack_f38);
            _auStack_f38 = (double)(int)(char)local_6cc;
            CrateValue::Set(value,(matrix3d *)auStack_f38);
            this_local._7_1_ = true;
            break;
          case 0xf:
            tinyusdz::value::matrix4d::matrix4d((matrix4d *)auStack_fc8);
            v_5.m[3][1] = 0.0;
            v_5.m[2][3] = 0.0;
            v_5.m[3][0] = 0.0;
            v_5.m[2][2] = 0.0;
            v_5.m[1][3] = 0.0;
            v_5.m[2][0] = 0.0;
            v_5.m[1][1] = 0.0;
            v_5.m[1][2] = 0.0;
            v_5.m[0][3] = 0.0;
            v_5.m[0][1] = 0.0;
            v_5.m[0][2] = 0.0;
            v_5.m[0][0] = 0.0;
            auStack_fc8 = (undefined1  [8])(double)(int)(char)local_6cc;
            v_5.m[1][0] = (double)(int)cStack_f3b;
            v_5.m[2][1] = (double)(int)cStack_6ca;
            v_5.m[3][2] = (double)(int)cStack_f39;
            CrateValue::Set(value,(matrix4d *)auStack_fc8);
            this_local._7_1_ = true;
            break;
          case 0x10:
          case 0x11:
          case 0x12:
            ::std::__cxx11::ostringstream::ostringstream(local_1140);
            poVar6 = ::std::operator<<((ostream *)local_1140,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x81e);
            ::std::operator<<(poVar6," ");
            poVar6 = ::std::operator<<((ostream *)local_1140,
                                       "Quaternion type is not allowed for Inlined Value.");
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)local_1160);
            ::std::__cxx11::string::~string((string *)local_1160);
            ::std::__cxx11::ostringstream::~ostringstream(local_1140);
            this_local._7_1_ = false;
            break;
          case 0x13:
            pvVar12 = ::std::array<double,_2UL>::operator[]
                                ((array<double,_2UL> *)(v_7._M_elems + 1),0);
            *pvVar12 = (double)(int)(char)local_6cc;
            pvVar12 = ::std::array<double,_2UL>::operator[]
                                ((array<double,_2UL> *)(v_7._M_elems + 1),1);
            *pvVar12 = (double)(int)cStack_f3b;
            CrateValue::Set(value,(double2 *)(v_7._M_elems + 1));
            this_local._7_1_ = true;
            break;
          case 0x14:
            v_7._M_elems[0]._2_2_ = uVar1;
            pvVar13 = ::std::array<float,_2UL>::operator[]((array<float,_2UL> *)&v_8,0);
            *pvVar13 = (float)(int)(char)local_6cc;
            iVar5 = (int)v_7._M_elems[0]._3_1_;
            pvVar13 = ::std::array<float,_2UL>::operator[]((array<float,_2UL> *)&v_8,1);
            *pvVar13 = (float)iVar5;
            CrateValue::Set(value,(float2 *)&v_8);
            this_local._7_1_ = true;
            break;
          case 0x15:
            hVar3 = tinyusdz::value::float_to_half_full((float)(int)(char)local_6cc);
            pvVar17 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                                ((array<tinyusdz::value::half,_3UL> *)&stack0xffffffffffffee74,0);
            pvVar17->value = hVar3.value;
            hVar3 = tinyusdz::value::float_to_half_full((float)(int)cStack_f3b);
            pvVar17 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                                ((array<tinyusdz::value::half,_3UL> *)&stack0xffffffffffffee74,1);
            pvVar17->value = hVar3.value;
            CrateValue::Set(value,(half3 *)&stack0xffffffffffffee74);
            this_local._7_1_ = true;
            break;
          case 0x16:
            pvVar14 = ::std::array<int,_2UL>::operator[]
                                ((array<int,_2UL> *)((long)v_10._M_elems + 0x14),0);
            *pvVar14 = (int)(char)local_6cc;
            pvVar14 = ::std::array<int,_2UL>::operator[]
                                ((array<int,_2UL> *)((long)v_10._M_elems + 0x14),1);
            *pvVar14 = (int)cStack_f3b;
            CrateValue::Set(value,(int2 *)((long)v_10._M_elems + 0x14));
            this_local._7_1_ = true;
            break;
          case 0x17:
            v_10._M_elems[2]._2_1_ = cStack_6ca;
            v_10._M_elems[2]._0_2_ = uVar1;
            pvVar15 = ::std::array<double,_3UL>::operator[]
                                ((array<double,_3UL> *)(v_11._M_elems + 2),0);
            *pvVar15 = (double)(int)(char)local_6cc;
            iVar5 = (int)v_10._M_elems[2]._1_1_;
            pvVar15 = ::std::array<double,_3UL>::operator[]
                                ((array<double,_3UL> *)(v_11._M_elems + 2),1);
            *pvVar15 = (double)iVar5;
            iVar5 = (int)v_10._M_elems[2]._2_1_;
            pvVar15 = ::std::array<double,_3UL>::operator[]
                                ((array<double,_3UL> *)(v_11._M_elems + 2),2);
            *pvVar15 = (double)iVar5;
            CrateValue::Set(value,(double3 *)(v_11._M_elems + 2));
            this_local._7_1_ = true;
            break;
          case 0x18:
            v_11._M_elems[1]._2_1_ = cStack_6ca;
            v_11._M_elems[1]._0_2_ = uVar1;
            pvVar16 = ::std::array<float,_3UL>::operator[]
                                ((array<float,_3UL> *)(v_12._M_elems + 1),0);
            *pvVar16 = (float)(int)(char)local_6cc;
            iVar5 = (int)v_11._M_elems[1]._1_1_;
            pvVar16 = ::std::array<float,_3UL>::operator[]
                                ((array<float,_3UL> *)(v_12._M_elems + 1),1);
            *pvVar16 = (float)iVar5;
            iVar5 = (int)v_11._M_elems[1]._2_1_;
            pvVar16 = ::std::array<float,_3UL>::operator[]
                                ((array<float,_3UL> *)(v_12._M_elems + 1),2);
            *pvVar16 = (float)iVar5;
            CrateValue::Set(value,(float3 *)(v_12._M_elems + 1));
            this_local._7_1_ = true;
            break;
          case 0x19:
            v_12._M_elems[0].value._0_1_ = cStack_6ca;
            hStack_11d4 = tinyusdz::value::float_to_half_full((float)(int)(char)local_6cc);
            pvVar17 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                                ((array<tinyusdz::value::half,_3UL> *)
                                 ((int8_t *)((long)register0x00000020 + -0x11d3) + 1),0);
            pvVar17->value = hStack_11d4.value;
            hVar3 = tinyusdz::value::float_to_half_full((float)(int)cStack_f3b);
            pvVar17 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                                ((array<tinyusdz::value::half,_3UL> *)
                                 ((int8_t *)((long)register0x00000020 + -0x11d3) + 1),1);
            pvVar17->value = hVar3.value;
            hVar3 = tinyusdz::value::float_to_half_full((float)(int)(char)v_12._M_elems[0].value);
            pvVar17 = ::std::array<tinyusdz::value::half,_3UL>::operator[]
                                ((array<tinyusdz::value::half,_3UL> *)
                                 ((int8_t *)((long)register0x00000020 + -0x11d3) + 1),2);
            pvVar17->value = hVar3.value;
            CrateValue::Set(value,(half3 *)((int8_t *)((long)register0x00000020 + -0x11d3) + 1));
            this_local._7_1_ = true;
            break;
          case 0x1a:
            pvVar18 = ::std::array<int,_3UL>::operator[]((array<int,_3UL> *)local_11e8,0);
            *pvVar18 = (int)(char)local_6cc;
            pvVar18 = ::std::array<int,_3UL>::operator[]((array<int,_3UL> *)local_11e8,1);
            *pvVar18 = (int)cStack_f3b;
            pvVar18 = ::std::array<int,_3UL>::operator[]((array<int,_3UL> *)local_11e8,2);
            *pvVar18 = (int)cStack_6ca;
            CrateValue::Set(value,(int3 *)local_11e8);
            this_local._7_1_ = true;
            break;
          case 0x1b:
            this_00 = v_15._M_elems + 3;
            pvVar19 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)this_00,0);
            *pvVar19 = (double)(int)(char)local_6cc;
            pvVar19 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)this_00,1);
            *pvVar19 = (double)(int)cStack_f3b;
            pvVar19 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)this_00,2);
            *pvVar19 = (double)(int)cStack_6ca;
            pvVar19 = ::std::array<double,_4UL>::operator[]
                                ((array<double,_4UL> *)(v_15._M_elems + 3),3);
            *pvVar19 = (double)(int)cStack_f39;
            CrateValue::Set(value,(double4 *)(v_15._M_elems + 3));
            this_local._7_1_ = true;
            break;
          case 0x1c:
            this_01 = v_16._M_elems + 2;
            v_15._M_elems[2] = v_18;
            pvVar20 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)this_01,0);
            *pvVar20 = (float)(int)(char)local_6cc;
            iVar5 = (int)v_15._M_elems[2]._1_1_;
            pvVar20 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)this_01,1);
            *pvVar20 = (float)iVar5;
            iVar5 = (int)v_15._M_elems[2]._2_1_;
            pvVar20 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)this_01,2);
            *pvVar20 = (float)iVar5;
            iVar5 = (int)v_15._M_elems[2]._3_1_;
            pvVar20 = ::std::array<float,_4UL>::operator[]
                                ((array<float,_4UL> *)(v_16._M_elems + 2),3);
            *pvVar20 = (float)iVar5;
            CrateValue::Set(value,(float4 *)(v_16._M_elems + 2));
            this_local._7_1_ = true;
            break;
          case 0x1d:
            v_16._M_elems._0_4_ = v_18;
            hVar3 = tinyusdz::value::float_to_half_full((float)(int)(char)local_6cc);
            pvVar21 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_1230,0);
            pvVar21->value = hVar3.value;
            hVar3 = tinyusdz::value::float_to_half_full((float)(int)(char)v_16._M_elems[0].value);
            pvVar21 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_1230,1);
            pvVar21->value = hVar3.value;
            hVar3 = tinyusdz::value::float_to_half_full((float)(int)(char)v_16._M_elems[0].value);
            pvVar21 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_1230,2);
            pvVar21->value = hVar3.value;
            hVar3 = tinyusdz::value::float_to_half_full((float)(int)(char)v_16._M_elems[0].value);
            pvVar21 = ::std::array<tinyusdz::value::half,_4UL>::operator[](&local_1230,3);
            pvVar21->value = hVar3.value;
            CrateValue::Set(value,&local_1230);
            this_local._7_1_ = true;
            break;
          case 0x1e:
            pvVar22 = ::std::array<int,_4UL>::operator[]
                                ((array<int,_4UL> *)
                                 ((long)&dict._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
                                 0);
            *pvVar22 = (int)(char)local_6cc;
            pvVar22 = ::std::array<int,_4UL>::operator[]
                                ((array<int,_4UL> *)
                                 ((long)&dict._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
                                 1);
            *pvVar22 = (int)cStack_f3b;
            pvVar22 = ::std::array<int,_4UL>::operator[]
                                ((array<int,_4UL> *)
                                 ((long)&dict._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
                                 2);
            *pvVar22 = (int)cStack_6ca;
            pvVar22 = ::std::array<int,_4UL>::operator[]
                                ((array<int,_4UL> *)
                                 ((long)&dict._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
                                 3);
            *pvVar22 = (int)cStack_f39;
            CrateValue::Set(value,(int4 *)((long)&dict._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count + 4));
            this_local._7_1_ = true;
            break;
          case 0x1f:
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)local_1280);
            CrateValue::Set(value,(CustomDataType *)local_1280);
            this_local._7_1_ = true;
            ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)local_1280);
            break;
          case 0x20:
          case 0x21:
          case 0x22:
          case 0x23:
          case 0x24:
          case 0x25:
          case 0x26:
          case 0x27:
            ::std::__cxx11::ostringstream::ostringstream(local_1400);
            poVar6 = ::std::operator<<((ostream *)local_1400,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,"[Crate]");
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x8f8);
            ::std::operator<<(poVar6," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1440,"ListOp data type `{}` cannot be inlined.",&local_1441);
            GetCrateDataTypeName_abi_cxx11_(&local_1468,(crate *)((ulong)dty.name & 0xffffffff),did)
            ;
            fmt::format<std::__cxx11::string>
                      (local_1420,(string *)local_1440,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1468);
            poVar6 = ::std::operator<<((ostream *)local_1400,(string *)local_1420);
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::string::~string((string *)local_1420);
            ::std::__cxx11::string::~string((string *)&local_1468);
            ::std::__cxx11::string::~string(local_1440);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1441);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_1488);
            ::std::__cxx11::string::~string((string *)&local_1488);
            this_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_1400);
            break;
          case 0x28:
          case 0x29:
          case 0x2d:
          case 0x2e:
          case 0x2f:
          case 0x30:
          case 0x31:
          case 0x32:
          case 0x37:
            ::std::__cxx11::ostringstream::ostringstream(local_1600);
            poVar6 = ::std::operator<<((ostream *)local_1600,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,"[Crate]");
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x904);
            ::std::operator<<(poVar6," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1640,"Data type `{}` cannot be inlined.",&local_1641);
            GetCrateDataTypeName_abi_cxx11_
                      (&local_1668,(crate *)((ulong)dty.name & 0xffffffff),did_00);
            fmt::format<std::__cxx11::string>
                      (local_1620,(string *)local_1640,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1668);
            poVar6 = ::std::operator<<((ostream *)local_1600,(string *)local_1620);
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::string::~string((string *)local_1620);
            ::std::__cxx11::string::~string((string *)&local_1668);
            ::std::__cxx11::string::~string(local_1640);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1641);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_1688);
            ::std::__cxx11::string::~string((string *)&local_1688);
            this_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_1600);
            break;
          case 0x2a:
            if ((uint)v_18 < 3) {
              val_2 = (Variability)v_18;
              CrateValue::Set(value,&val_2);
              this_local._7_1_ = true;
            }
            else {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Invalid value for Specifier\n");
              this_local._7_1_ = false;
            }
            break;
          case 0x2b:
            if ((uint)v_18 < 2) {
              fStack_e70 = v_18;
              CrateValue::Set(value,(Permission *)&stack0xfffffffffffff190);
              this_local._7_1_ = true;
            }
            else {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Invalid value for Permission\n");
              this_local._7_1_ = false;
            }
            break;
          case 0x2c:
            if ((uint)v_18 < 3) {
              local_e74 = v_18;
              CrateValue::Set(value,(Variability *)&local_e74);
              this_local._7_1_ = true;
            }
            else {
              ::std::__cxx11::string::operator+=
                        ((string *)&this->_err,"Invalid value for Variability\n");
              this_local._7_1_ = false;
            }
            break;
          case 0x33:
            CrateValue::Set(value,&local_1281);
            this_local._7_1_ = true;
            break;
          case 0x34:
          case 0x35:
          case 0x36:
          case 0x38:
            ::std::__cxx11::ostringstream::ostringstream(local_1800);
            poVar6 = ::std::operator<<((ostream *)local_1800,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x90d);
            ::std::operator<<(poVar6," ");
            GetCrateDataTypeName_abi_cxx11_
                      (&local_1840,(crate *)((ulong)dty.name & 0xffffffff),did_01);
            ::std::operator+((char *)local_1820,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Invalid data type(or maybe not supported in TinyUSDZ yet) for Inlined value: "
                            );
            poVar6 = ::std::operator<<((ostream *)local_1800,local_1820);
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::string::~string(local_1820);
            ::std::__cxx11::string::~string((string *)&local_1840);
            ::std::__cxx11::ostringstream::str();
            PushError(this,&local_1860);
            ::std::__cxx11::string::~string((string *)&local_1860);
            ::std::__cxx11::ostringstream::~ostringstream(local_1800);
            this_local._7_1_ = false;
            break;
          default:
            this_local._7_1_ = false;
          }
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_360);
      poVar6 = ::std::operator<<((ostream *)local_360,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x721);
      ::std::operator<<(poVar6," ");
      peVar7 = nonstd::expected_lite::
               expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1e8);
      poVar6 = ::std::operator<<((ostream *)local_360,(string *)peVar7);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_380);
      ::std::__cxx11::string::~string((string *)&local_380);
      ::std::__cxx11::ostringstream::~ostringstream(local_360);
      this_local._7_1_ = false;
    }
    nonstd::expected_lite::
    expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected((expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1e8);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar6 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar6 = ::std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar6 = ::std::operator<<(poVar6,":");
    poVar6 = ::std::operator<<(poVar6,"UnpackInlinedValueRep");
    poVar6 = ::std::operator<<(poVar6,"():");
    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x71b);
    ::std::operator<<(poVar6," ");
    poVar6 = ::std::operator<<((ostream *)local_1a0,"ValueRep must be inlined value representation."
                              );
    ::std::operator<<(poVar6,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)
                   &tyRet.contained.
                    super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .m_has_value);
    ::std::__cxx11::string::~string
              ((string *)
               &tyRet.contained.
                super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .m_has_value);
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CrateReader::UnpackInlinedValueRep(const crate::ValueRep &rep,
                                        crate::CrateValue *value) {
  if (!rep.IsInlined()) {
    PUSH_ERROR("ValueRep must be inlined value representation.");
    return false;
  }

  const auto tyRet = crate::GetCrateDataType(rep.GetType());
  if (!tyRet) {
    PUSH_ERROR(tyRet.error());
    return false;
  }

  if (rep.IsCompressed()) {
    PUSH_ERROR("Inlinved value must not be compressed.");
    return false;
  }

  if (rep.IsArray()) {
    PUSH_ERROR("Inlined value must not be an array.");
    return false;
  }

  const auto dty = tyRet.value();
  DCOUT(crate::GetCrateDataTypeRepr(dty));

  uint32_t d = (rep.GetPayload() & ((1ull << (sizeof(uint32_t) * 8)) - 1));
  DCOUT("d = " << d);

  // TODO(syoyo): Use template SFINE?
  switch (dty.dtype_id) {
    case crate::CrateDataTypeId::NumDataTypes:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INVALID: {
      PUSH_ERROR("`Invalid` DataType.");
      return false;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_BOOL: {
      value->Set(d ? true : false);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH: {
      // AssetPath = TokenIndex for inlined value.
      if (auto v = GetToken(crate::Index(d))) {
        std::string str = v.value().str();

        value::AssetPath assetp(str);
        value->Set(assetp);
        return true;
      } else {
        PUSH_ERROR("Invalid Index for AssetPath.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN: {
      if (auto v = GetToken(crate::Index(d))) {
        value::token tok = v.value();

        DCOUT("value.token = " << tok);

        value->Set(tok);

        return true;
      } else {
        PUSH_ERROR("Invalid Index for Token.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING: {
      if (auto v = GetStringToken(crate::Index(d))) {
        std::string str = v.value().str();

        DCOUT("value.string = " << str);

        value->Set(str);

        return true;
      } else {
        PUSH_ERROR("Invalid Index for StringToken.");
        return false;
      }
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_SPECIFIER: {
      if (d >= static_cast<int>(Specifier::Invalid)) {
        _err += "Invalid value for Specifier\n";
        return false;
      }
      Specifier val = static_cast<Specifier>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PERMISSION: {
      if (d >= static_cast<int>(Permission::Invalid)) {
        _err += "Invalid value for Permission\n";
        return false;
      }
      Permission val = static_cast<Permission>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VARIABILITY: {
      if (d >= static_cast<int>(Variability::Invalid)) {
        _err += "Invalid value for Variability\n";
        return false;
      }
      Variability val = static_cast<Variability>(d);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UCHAR: {
      uint8_t val;
      memcpy(&val, &d, 1);

      DCOUT("value.uchar = " << val);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT: {
      int ival;
      memcpy(&ival, &d, sizeof(int));

      DCOUT("value.int = " << ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT: {
      uint32_t val;
      memcpy(&val, &d, sizeof(uint32_t));

      DCOUT("value.uint = " << val);

      value->Set(val);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT64: {
      // stored as int
      int _ival;
      memcpy(&_ival, &d, sizeof(int));

      DCOUT("value.int = " << _ival);

      int64_t ival = static_cast<int64_t>(_ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT64: {
      // stored as uint32
      uint32_t _ival;
      memcpy(&_ival, &d, sizeof(uint32_t));

      DCOUT("value.int = " << _ival);

      uint64_t ival = static_cast<uint64_t>(_ival);

      value->Set(ival);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_HALF: {
      value::half f;
      memcpy(&f, &d, sizeof(value::half));

      DCOUT("value.half = " << f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_FLOAT: {
      float f;
      memcpy(&f, &d, sizeof(float));

      DCOUT("value.float = " << f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE: {
      // stored as float
      float _f;
      memcpy(&_f, &d, sizeof(float));

      double f = static_cast<double>(_f);

      value->Set(f);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::matrix2d v;
      memset(v.m, 0, sizeof(value::matrix2d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << "\n");

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::matrix3d v;
      memset(v.m, 0, sizeof(value::matrix3d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);
      v.m[2][2] = static_cast<double>(data[2]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << ", "
                                    << v.m[2][2] << "\n");

      value->Set(v);

      return true;
    }

    case crate::CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D: {
      // Matrix contains diagnonal components only, and values are represented
      // in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::matrix4d v;
      memset(v.m, 0, sizeof(value::matrix4d));
      v.m[0][0] = static_cast<double>(data[0]);
      v.m[1][1] = static_cast<double>(data[1]);
      v.m[2][2] = static_cast<double>(data[2]);
      v.m[3][3] = static_cast<double>(data[3]);

      DCOUT("value.matrix(diag) = " << v.m[0][0] << ", " << v.m[1][1] << ", "
                                    << v.m[2][2] << ", " << v.m[3][3]);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATD:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATF:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_QUATH: {
      // Seems quaternion type is not allowed for Inlined Value.
      PUSH_ERROR("Quaternion type is not allowed for Inlined Value.");
      return false;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2D: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::double2 v;
      v[0] = double(data[0]);
      v[1] = double(data[1]);

      DCOUT("value.double2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2F: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::float2 v;
      v[0] = float(data[0]);
      v[1] = float(data[1]);

      DCOUT("value.float2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2H: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::half3 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[1]));

      DCOUT("value.half2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC2I: {
      // Value is represented in int8
      int8_t data[2];
      memcpy(&data, &d, 2);

      value::int2 v;
      v[0] = int(data[0]);
      v[1] = int(data[1]);

      DCOUT("value.int2 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3D: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::double3 v;
      v[0] = double(data[0]);
      v[1] = double(data[1]);
      v[2] = double(data[2]);

      DCOUT("value.double3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3F: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::float3 v;
      v[0] = float(data[0]);
      v[1] = float(data[1]);
      v[2] = float(data[2]);

      DCOUT("value.float3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3H: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::half3 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[1]));
      v[2] = value::float_to_half_full(float(data[2]));

      DCOUT("value.half3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC3I: {
      // Value is represented in int8
      int8_t data[3];
      memcpy(&data, &d, 3);

      value::int3 v;
      v[0] = static_cast<int32_t>(data[0]);
      v[1] = static_cast<int32_t>(data[1]);
      v[2] = static_cast<int32_t>(data[2]);

      DCOUT("value.int3 = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4D: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::double4 v;
      v[0] = static_cast<double>(data[0]);
      v[1] = static_cast<double>(data[1]);
      v[2] = static_cast<double>(data[2]);
      v[3] = static_cast<double>(data[3]);

      DCOUT("value.doublef = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4F: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::float4 v;
      v[0] = static_cast<float>(data[0]);
      v[1] = static_cast<float>(data[1]);
      v[2] = static_cast<float>(data[2]);
      v[3] = static_cast<float>(data[3]);

      DCOUT("value.vec4f = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4H: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::half4 v;
      v[0] = value::float_to_half_full(float(data[0]));
      v[1] = value::float_to_half_full(float(data[0]));
      v[2] = value::float_to_half_full(float(data[0]));
      v[3] = value::float_to_half_full(float(data[0]));

      DCOUT("value.vec4h = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VEC4I: {
      // Value is represented in int8
      int8_t data[4];
      memcpy(&data, &d, 4);

      value::int4 v;
      v[0] = static_cast<int32_t>(data[0]);
      v[1] = static_cast<int32_t>(data[1]);
      v[2] = static_cast<int32_t>(data[2]);
      v[3] = static_cast<int32_t>(data[3]);

      DCOUT("value.vec4i = " << v);

      value->Set(v);

      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DICTIONARY: {
      // empty dict is allowed
      // TODO: empty(zero value) check?
      //crate::CrateValue::Dictionary dict;
      CustomDataType dict; // use CustomDataType for Dict
      value->Set(dict);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VALUE_BLOCK: {
      // Guess No content for ValueBlock
      value::ValueBlock block;
      value->Set(block);
      return true;
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PATH_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_REFERENCE_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_INT64_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UINT64_LIST_OP: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("ListOp data type `{}` cannot be inlined.",
          crate::GetCrateDataTypeName(dty.dtype_id)));
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PATH_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VARIANT_SELECTION_MAP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TIME_SAMPLES:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_LAYER_OFFSET_VECTOR:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_STRING_VECTOR: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Data type `{}` cannot be inlined.",
          crate::GetCrateDataTypeName(dty.dtype_id)));
    }
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_VALUE:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE_LIST_OP:
    case crate::CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE: {
      PUSH_ERROR(
          "Invalid data type(or maybe not supported in TinyUSDZ yet) for "
          "Inlined value: " +
          crate::GetCrateDataTypeName(dty.dtype_id));
      return false;
    }
  }

  // Should never reach here.
  return false;
}